

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

bool __thiscall units::unit::operator==(unit *this,unit *other)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (other->base_units_ != this->base_units_) {
    return false;
  }
  fVar1 = this->multiplier_;
  fVar4 = other->multiplier_;
  if ((fVar1 != fVar4) || (NAN(fVar1) || NAN(fVar4))) {
    fVar5 = fVar1 - fVar4;
    if (((fVar5 != 0.0) || (NAN(fVar5))) && ((NAN(fVar5) || (0x7ffffe < (int)ABS(fVar5) - 1U)))) {
      fVar5 = (float)((int)fVar1 + 8U & 0xfffffff0);
      fVar2 = (float)((int)fVar4 + 8U & 0xfffffff0);
      if ((fVar5 != fVar2) || (NAN(fVar5) || NAN(fVar2))) {
        fVar3 = (float)((int)(fVar4 * 1.0000005) + 8U & 0xfffffff0);
        if ((fVar3 != fVar5) || (NAN(fVar3) || NAN(fVar5))) {
          fVar4 = (float)((int)(fVar4 * 0.9999995) + 8U & 0xfffffff0);
          if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
            fVar4 = (float)((int)(fVar1 * 1.0000005) + 8U & 0xfffffff0);
            if ((fVar4 != fVar2) || (NAN(fVar4) || NAN(fVar2))) {
              return (bool)(-((float)((int)(fVar1 * 0.9999995) + 8U & 0xfffffff0) == fVar2) & 1);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }